

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

int lws_write_numeric_address(uint8_t *ads,int size,char *buf,size_t len)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  ushort uVar7;
  char cVar8;
  char *str;
  char *pcVar9;
  char local_4d;
  int local_38;
  
  if (size == 4) {
    local_38 = lws_snprintf(buf,len,"%u.%u.%u.%u",(ulong)*ads,(ulong)ads[1],(ulong)ads[2],
                            (uint)ads[3]);
  }
  else {
    local_38 = -1;
    if (size == 0x10) {
      pcVar9 = buf + len;
      local_4d = -1;
      iVar4 = 0;
      cVar8 = '\0';
      bVar6 = false;
      bVar3 = false;
      bVar1 = false;
      str = buf;
      do {
        bVar2 = true;
        if (str + 8 <= pcVar9) {
          uVar7 = *(ushort *)(ads + iVar4) << 8 | *(ushort *)(ads + iVar4) >> 8;
          iVar5 = iVar4 + 2;
          if (bVar1) {
            if (uVar7 != 0) {
              *str = ':';
              str = str + 1;
            }
          }
          else if ((!bVar3) && (uVar7 == 0)) {
            bVar2 = false;
            bVar1 = true;
            bVar3 = true;
            iVar4 = iVar5;
            local_4d = cVar8;
            goto LAB_001128de;
          }
          if (bVar6) {
            iVar4 = lws_snprintf(str,(long)pcVar9 - (long)str,"%u.%u",(ulong)ads[iVar4],
                                 (ulong)ads[(long)iVar4 + 1]);
            str = str + (char)iVar4;
            bVar6 = true;
            if (cVar8 == '\x06') {
              *str = '.';
              str = str + 1;
            }
LAB_0011282c:
            bVar2 = false;
            iVar4 = iVar5;
          }
          else if ((bVar1) && (uVar7 == 0)) {
            bVar6 = false;
            bVar2 = false;
            iVar4 = iVar5;
          }
          else {
            if (cVar8 != '\0') {
              *str = ':';
              str = str + 1;
            }
            iVar4 = lws_snprintf(str,(long)pcVar9 - (long)str,"%x",(ulong)uVar7);
            str = str + iVar4;
            if ((bVar1) && (uVar7 != 0)) {
              bVar6 = (local_4d == '\0' && cVar8 == '\x05') && uVar7 == 0xffff;
              if (bVar6) {
                *str = ':';
                str = str + 1;
              }
              bVar1 = false;
              goto LAB_0011282c;
            }
            bVar2 = false;
            bVar6 = false;
            iVar4 = iVar5;
          }
        }
LAB_001128de:
        if (bVar2) {
          return -1;
        }
        cVar8 = cVar8 + '\x01';
      } while (cVar8 != '\b');
      local_38 = -1;
      if (str + 3 <= pcVar9) {
        if (bVar1) {
          str[0] = ':';
          str[1] = ':';
          str[2] = '\0';
          str = str + 2;
        }
        local_38 = (int)buf;
        local_38 = (int)str - local_38;
      }
    }
  }
  return local_38;
}

Assistant:

int
lws_write_numeric_address(const uint8_t *ads, int size, char *buf, size_t len)
{
	char c, elided = 0, soe = 0, zb = -1, n, ipv4 = 0;
	const char *e = buf + len;
	char *obuf = buf;
	int q = 0;

	if (size == 4)
		return lws_snprintf(buf, len, "%u.%u.%u.%u",
				    ads[0], ads[1], ads[2], ads[3]);

	if (size != 16)
		return -1;

	for (c = 0; c < (char)size / 2; c++) {
		uint16_t v = (ads[q] << 8) | ads[q + 1];

		if (buf + 8 > e)
			return -1;

		q += 2;
		if (soe) {
			if (v)
				*buf++ = ':';
				/* fall thru to print hex value */
		} else
			if (!elided && !soe && !v) {
				elided = soe = 1;
				zb = c;
				continue;
			}

		if (ipv4) {
			n = lws_snprintf(buf, e - buf, "%u.%u",
					ads[q - 2], ads[q - 1]);
			buf += n;
			if (c == 6)
				*buf++ = '.';
		} else {
			if (soe && !v)
				continue;
			if (c)
				*buf++ = ':';

			buf += lws_snprintf(buf, e - buf, "%x", v);

			if (soe && v) {
				soe = 0;
				if (c == 5 && v == 0xffff && !zb) {
					ipv4 = 1;
					*buf++ = ':';
				}
			}
		}
	}
	if (buf + 3 > e)
		return -1;

	if (soe) { /* as is the case for all zeros */
		*buf++ = ':';
		*buf++ = ':';
		*buf = '\0';
	}

	return lws_ptr_diff(buf, obuf);
}